

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O3

sysbvm_tuple_t sysbvm_integer_normalize(sysbvm_context_t *context,sysbvm_integer_t *integer)

{
  long lVar1;
  long lVar2;
  sysbvm_tuple_t type;
  sysbvm_object_tuple_t *psVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t byteSize;
  ulong uVar7;
  
  uVar4 = (ulong)integer & 0xf;
  if (uVar4 != 0 || integer == (sysbvm_integer_t *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (ulong)((integer->header).objectSize >> 2);
  }
  uVar6 = (ulong)(uint)((int)uVar7 * 4);
  byteSize = uVar6 + 4;
  lVar5 = 0;
  do {
    if (uVar7 + lVar5 == 0) {
      if (uVar7 != 0) {
        return 1;
      }
      return (sysbvm_tuple_t)integer;
    }
    lVar1 = lVar5 + -1;
    byteSize = byteSize - 4;
    lVar2 = lVar5 * 4;
    lVar5 = lVar1;
  } while (*(int *)((long)integer->words + lVar2 + uVar6 + -4) != 0);
  if (lVar1 != -1) {
    uVar7 = uVar7 + lVar1 + 1;
    if (uVar4 != 0 || integer == (sysbvm_integer_t *)0x0) {
      if ((int)uVar4 == 0xf) {
        type = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)integer >> 4);
      }
      else {
        type = sysbvm_tuple_getImmediateTypeWithTag(context,uVar4);
      }
    }
    else {
      type = (integer->header).field_0.typePointer;
    }
    if (uVar7 < 3) {
      uVar4 = *(ulong *)integer->words;
      if (type == (context->roots).largeNegativeIntegerType) {
        if (uVar4 < 0x800000000000001) {
          return uVar4 * -0x10 + 1;
        }
      }
      else if (*(uint *)&integer->field_0x14 < 0x8000000) {
        return uVar4 * 0x10 + 1;
      }
    }
    psVar3 = sysbvm_context_allocateByteTuple(context,type,byteSize);
    memcpy(&psVar3->field_1,integer->words,byteSize);
    return uVar7;
  }
  return (sysbvm_tuple_t)integer;
}

Assistant:

static sysbvm_tuple_t sysbvm_integer_normalize(sysbvm_context_t *context, sysbvm_integer_t *integer)
{
    // Counte the required number of normalized words.
    size_t wordCount = sysbvm_tuple_getSizeInBytes((sysbvm_tuple_t)integer) / 4;
    size_t normalizedWordCount = wordCount;
    while(normalizedWordCount > 0 && integer->words[normalizedWordCount - 1])
        --normalizedWordCount;

    // Trivial cases.
    if(normalizedWordCount == wordCount)
    {
        return (sysbvm_tuple_t)integer;
    }
    else if(normalizedWordCount == 0)
    {
        return sysbvm_tuple_integer_encodeSmall(0);
    }
    
    // Attempt to fit in an immediate, if possible.
    sysbvm_tuple_t largeIntegerType = sysbvm_tuple_getType(context, (sysbvm_tuple_t)integer);
    bool isNegative = largeIntegerType == context->roots.largeNegativeIntegerType;
    if(normalizedWordCount <= 2)
    {
        uint64_t valueUInt64 = (uint64_t)integer->words[0] | ((uint64_t)integer->words[1] << 32);
        if(isNegative)
        {
            if(valueUInt64 <= (uint64_t)-SYSBVM_IMMEDIATE_INT_MIN)
                return (sysbvm_tuple_t)sysbvm_tuple_integer_encodeSmall(-(sysbvm_stuple_t)valueUInt64);
        }
        else
        {
            if(valueUInt64 <= SYSBVM_IMMEDIATE_INT_MAX)
                return (sysbvm_tuple_t)sysbvm_tuple_integer_encodeSmall((sysbvm_stuple_t)valueUInt64);
        }
    }

    // Make a newer smaller large integer.
    sysbvm_integer_t *normalizedResult = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, largeIntegerType, normalizedWordCount*4);
    memcpy(normalizedResult->words, integer->words, 4*normalizedWordCount);
    return (sysbvm_tuple_t)normalizedWordCount;
}